

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

void rec_tsetm(jit_State *J,BCReg ra,BCReg rn,int32_t i)

{
  uint slot;
  TValue *pTVar1;
  TRef TVar2;
  int iVar3;
  ulong uVar4;
  RecordIndex ix;
  TValue local_78;
  double local_70;
  TValue local_68;
  TRef local_48;
  TRef local_44;
  TRef local_40;
  undefined4 local_34;
  
  pTVar1 = J->L->base;
  slot = ra - 1;
  local_78.field_2.field_0 = pTVar1[slot].field_2.field_0;
  local_78.field_2.it = 0xfffffff4;
  local_48 = J->base[slot];
  if (local_48 == 0) {
    local_48 = sload(J,slot);
  }
  local_34 = 0;
  iVar3 = rn - ra;
  if (ra <= rn && iVar3 != 0) {
    uVar4 = (ulong)ra;
    do {
      local_70 = (double)i;
      local_44 = lj_ir_kint(J,i);
      local_68 = pTVar1[uVar4];
      TVar2 = J->base[uVar4];
      if (TVar2 == 0) {
        TVar2 = sload(J,(int32_t)uVar4);
      }
      local_40 = TVar2;
      lj_record_idx(J,(RecordIndex *)&local_78.field_2);
      i = i + 1;
      uVar4 = uVar4 + 1;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  return;
}

Assistant:

static void rec_tsetm(jit_State *J, BCReg ra, BCReg rn, int32_t i)
{
  RecordIndex ix;
  cTValue *basev = J->L->base;
  GCtab *t = tabV(&basev[ra-1]);
  settabV(J->L, &ix.tabv, t);
  ix.tab = getslot(J, ra-1);
  ix.idxchain = 0;
#ifdef LUAJIT_ENABLE_TABLE_BUMP
  if ((J->flags & JIT_F_OPT_SINK)) {
    if (t->asize < i+rn-ra)
      lj_tab_reasize(J->L, t, i+rn-ra);
    setnilV(&ix.keyv);
    rec_idx_bump(J, &ix);
  }
#endif
  for (; ra < rn; i++, ra++) {
    setintV(&ix.keyv, i);
    ix.key = lj_ir_kint(J, i);
    copyTV(J->L, &ix.valv, &basev[ra]);
    ix.val = getslot(J, ra);
    lj_record_idx(J, &ix);
  }
}